

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void liblogger::LogManager::Remove(shared_ptr<liblogger::ILogger> *Log)

{
  LogException *this;
  long lVar1;
  LogManagerScopedLock lock;
  string local_40;
  
  LogMutex::Lock((LogMutex *)m_mutex);
  lVar1 = DAT_001483c0;
  std::__cxx11::
  list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>::
  remove((list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
          *)&m_loggers_abi_cxx11_,(char *)Log);
  if (lVar1 == DAT_001483c0) {
    this = (LogException *)__cxa_allocate_exception(0x28);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"LogManager::Remove cannot find logging module","");
    LogException::LogException(this,&local_40);
    __cxa_throw(this,&LogException::typeinfo,LogException::~LogException);
  }
  LogMutex::Unlock((LogMutex *)m_mutex);
  return;
}

Assistant:

void LogManager::Remove(std::shared_ptr<ILogger> Log)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	size_t size = m_loggers.size();
	m_loggers.remove(Log);
	if (size == m_loggers.size())
		throw(LogException("LogManager::Remove cannot find logging module"));
#ifdef DEBUG
	std::string str = Log->GetName();
	Logger(LOGGER_DEBUG, "Removed Logger: %s", str.c_str());
#endif
}